

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

int decode(uchar *infile,int *a,int *nx,int *ny,int *scale)

{
  char acVar1 [2];
  int iVar2;
  LONGLONG LVar3;
  int *in_RCX;
  int *in_RDX;
  uchar *in_RSI;
  int *in_R8;
  char tmagic [2];
  uchar nbitplanes [3];
  int stat;
  LONGLONG sumall;
  undefined7 in_stack_ffffffffffffffb8;
  char in_stack_ffffffffffffffbf;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 local_4;
  
  nextchar = 0;
  qread((uchar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
        (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),0);
  acVar1[1] = (char)in_stack_ffffffffffffffc0;
  acVar1[0] = in_stack_ffffffffffffffbf;
  if (acVar1 == code_magic) {
    iVar2 = readint((uchar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    *in_RDX = iVar2;
    iVar2 = readint((uchar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    *in_RCX = iVar2;
    iVar2 = readint((uchar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    *in_R8 = iVar2;
    LVar3 = readlonglong((uchar *)in_R8);
    qread((uchar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
          (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),0);
    local_4 = dodecode(in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20),(int)in_RCX,(uchar *)in_R8);
    *(int *)in_RSI = (int)LVar3;
  }
  else {
    ffpmsg((char *)0x278ef5);
    local_4 = 0x19e;
  }
  return local_4;
}

Assistant:

static int decode(unsigned char *infile, int *a, int *nx, int *ny, int *scale)
/*
char *infile;				 input file							
int  *a;				 address of output array [nx][ny]		
int  *nx,*ny;				 size of output array					
int  *scale;				 scale factor for digitization		
*/
{
LONGLONG sumall;
int stat;
unsigned char nbitplanes[3];
char tmagic[2];

	/* initialize the byte read position to the beginning of the array */;
	nextchar = 0;
	
	/*
	 * File starts either with special 2-byte magic code or with
	 * FITS keyword "SIMPLE  ="
	 */
	qread(infile, tmagic, sizeof(tmagic));
	/*
	 * check for correct magic code value
	 */
	if (memcmp(tmagic,code_magic,sizeof(code_magic)) != 0) {
		ffpmsg("bad file format");
		return(DATA_DECOMPRESSION_ERR);
	}
	*nx =readint(infile);				/* x size of image			*/
	*ny =readint(infile);				/* y size of image			*/
	*scale=readint(infile);				/* scale factor for digitization	*/
	
	/* sum of all pixels	*/
	sumall=readlonglong(infile);
	/* # bits in quadrants	*/

	qread(infile, (char *) nbitplanes, sizeof(nbitplanes));

	stat = dodecode(infile, a, *nx, *ny, nbitplanes);
	/*
	 * put sum of all pixels back into pixel 0
	 */
	a[0] = (int) sumall;
	return(stat);
}